

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *pFVar7;
  char **ppcVar8;
  uint *puVar9;
  bool bVar10;
  char *pcVar11;
  size_t size;
  char *type1_output;
  char *type3_input;
  char *type1_input;
  char *type3_output;
  char *endptr;
  char buf [1024];
  char *local_480;
  size_t local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char local_438 [1032];
  
  local_450 = (char *)0x0;
  local_458 = (char *)0x0;
  local_460 = (char *)0x0;
  local_448 = (char *)0x0;
  local_478 = 0;
  local_438[0] = '\0';
  if (argc < 2) {
    pcVar11 = "no";
    local_480 = "unknown";
    pcVar4 = "unknown";
    pcVar5 = "unknown";
  }
  else {
    iVar3 = 1;
    bVar10 = false;
    local_470 = "unknown";
    local_480 = "unknown";
    local_468 = "unknown";
    do {
      pcVar4 = argv[iVar3];
      iVar1 = strcmp("--use-cached-creds",pcVar4);
      if (iVar1 == 0) {
        bVar10 = true;
        iVar1 = iVar3 + 1;
      }
      else {
        iVar1 = strcmp("--helper-protocol",pcVar4);
        if (iVar1 == 0) {
          iVar1 = iVar3 + 1;
          if (iVar1 < argc) {
            local_470 = argv[iVar1];
            iVar1 = iVar3 + 2;
          }
        }
        else {
          iVar1 = strcmp("--username",pcVar4);
          if (iVar1 == 0) {
            iVar1 = iVar3 + 1;
            if (iVar1 < argc) {
              local_468 = argv[iVar1];
              iVar1 = iVar3 + 2;
            }
          }
          else {
            iVar1 = strcmp("--domain",pcVar4);
            if (iVar1 != 0) {
              puts(
                  "Usage: fake_ntlm [option]\n --use-cached-creds\n --helper-protocol [protocol]\n --username [username]\n --domain [domain]"
                  );
              goto LAB_0010502a;
            }
            iVar1 = iVar3 + 1;
            if (iVar1 < argc) {
              local_480 = argv[iVar1];
              iVar1 = iVar3 + 2;
            }
          }
        }
      }
      iVar3 = iVar1;
    } while (iVar3 < argc);
    pcVar11 = "no";
    pcVar4 = local_470;
    pcVar5 = local_468;
    if (bVar10) {
      pcVar11 = "yes";
    }
  }
  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",pcVar5,pcVar4,local_480,
         pcVar11);
  pcVar4 = getenv("CURL_NTLM_AUTH_TESTNUM");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Test number not specified in CURL_NTLM_AUTH_TESTNUM";
  }
  else {
    pcVar5 = (char *)strtol(pcVar4,&local_440,10);
    sVar6 = strlen(pcVar4);
    if ((local_440 == pcVar4 + sVar6) && (0 < (long)pcVar5)) {
      pcVar4 = getenv("CURL_NTLM_AUTH_SRCDIR");
      if (pcVar4 != (char *)0x0) {
        path = pcVar4;
      }
      pcVar4 = test2file((long)pcVar5);
      pFVar7 = fopen64(pcVar4,"rb");
      if (pFVar7 == (FILE *)0x0) {
LAB_00104fe5:
        puVar9 = (uint *)__errno_location();
        uVar2 = *puVar9;
        pcVar11 = strerror(uVar2);
        logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar11);
        logmsg("Error opening file: %s",pcVar4);
        pcVar4 = "Couldn\'t open test file %ld";
LAB_00105023:
        logmsg(pcVar4,pcVar5);
      }
      else {
        uVar2 = getpart(&local_450,&local_478,"ntlm_auth_type1","input",(FILE *)pFVar7);
        fclose(pFVar7);
        if ((uVar2 == 0) && (local_478 != 0)) {
          pFVar7 = fopen64(pcVar4,"rb");
          if (pFVar7 == (FILE *)0x0) goto LAB_00104fe5;
          local_478 = 0;
          local_470 = pcVar5;
          uVar2 = getpart(&local_458,&local_478,"ntlm_auth_type3","input",(FILE *)pFVar7);
          fclose(pFVar7);
          if ((uVar2 == 0) && (local_478 != 0)) {
            pcVar5 = fgets(local_438,0x400,_stdin);
            if (pcVar5 != (char *)0x0) {
              do {
                iVar3 = strcmp(local_438,local_450);
                pcVar5 = local_458;
                if (iVar3 == 0) {
                  pFVar7 = fopen64(pcVar4,"rb");
                  if (pFVar7 == (FILE *)0x0) {
LAB_00104f2e:
                    puVar9 = (uint *)__errno_location();
                    uVar2 = *puVar9;
                    pcVar5 = strerror(uVar2);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar5);
                    logmsg("Error opening file: %s",pcVar4);
                    pcVar4 = "Couldn\'t open test file %ld";
                    pcVar5 = local_470;
                    goto LAB_00105023;
                  }
                  local_478 = 0;
                  uVar2 = getpart(&local_460,&local_478,"ntlm_auth_type1","output",(FILE *)pFVar7);
                  fclose(pFVar7);
                  if ((uVar2 != 0) || (ppcVar8 = &local_460, local_478 == 0)) {
                    pcVar4 = "getpart() type 1 output failed with error: %d";
                    goto LAB_00104fae;
                  }
                }
                else {
                  sVar6 = strlen(local_458);
                  iVar3 = strncmp(local_438,pcVar5,sVar6);
                  if (iVar3 != 0) {
                    curl_mprintf("Unknown request\n");
                    pcVar4 = printable(local_438,(size_t)pcVar5);
                    if (pcVar4 != (char *)0x0) {
                      logmsg("invalid input: \'%s\'\n",pcVar4);
                      free(pcVar4);
                      goto LAB_0010502a;
                    }
                    pcVar4 = "OOM formatting invalid input: \'%s\'\n";
                    pcVar5 = local_438;
                    goto LAB_00105023;
                  }
                  pFVar7 = fopen64(pcVar4,"rb");
                  if (pFVar7 == (FILE *)0x0) goto LAB_00104f2e;
                  local_478 = 0;
                  uVar2 = getpart(&local_448,&local_478,"ntlm_auth_type3","output",(FILE *)pFVar7);
                  fclose(pFVar7);
                  if ((uVar2 != 0) || (ppcVar8 = &local_448, local_478 == 0)) {
                    pcVar4 = "getpart() type 3 output failed with error: %d";
                    goto LAB_00104fae;
                  }
                }
                curl_mprintf("%s",*ppcVar8);
                fflush(_stdout);
                pcVar5 = fgets(local_438,0x400,_stdin);
              } while (pcVar5 != (char *)0x0);
            }
            return 1;
          }
          pcVar4 = "getpart() type 3 input failed with error: %d";
        }
        else {
          pcVar4 = "getpart() type 1 input failed with error: %d";
        }
LAB_00104fae:
        logmsg(pcVar4,(ulong)uVar2);
      }
      goto LAB_0010502a;
    }
    pcVar4 = "Test number not valid in CURL_NTLM_AUTH_TESTNUM";
  }
  logmsg(pcVar4);
LAB_0010502a:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  char buf[1024];
  FILE *stream;
  char *filename;
  int error;
  char *type1_input = NULL, *type3_input = NULL;
  char *type1_output = NULL, *type3_output = NULL;
  size_t size = 0;
  long testnum;
  const char *env;
  int arg = 1;
  char *helper_user = (char *)"unknown";
  char *helper_proto = (char *)"unknown";
  char *helper_domain = (char *)"unknown";
  bool use_cached_creds = FALSE;
  char *msgbuf;

  buf[0] = '\0';

  while(argc > arg) {
    if(!strcmp("--use-cached-creds", argv[arg])) {
      use_cached_creds = TRUE;
      arg++;
    }
    else if(!strcmp("--helper-protocol", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_proto = argv[arg++];
    }
    else if(!strcmp("--username", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_user = argv[arg++];
    }
    else if(!strcmp("--domain", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_domain = argv[arg++];
    }
    else {
      puts("Usage: fake_ntlm [option]\n"
           " --use-cached-creds\n"
           " --helper-protocol [protocol]\n"
           " --username [username]\n"
           " --domain [domain]");
      exit(1);
    }
  }

  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",
         helper_user, helper_proto, helper_domain,
         (use_cached_creds) ? "yes" : "no");

  env = getenv("CURL_NTLM_AUTH_TESTNUM");
  if(env) {
    char *endptr;
    long lnum = strtol(env, &endptr, 10);
    if((endptr != env + strlen(env)) || (lnum < 1L)) {
      logmsg("Test number not valid in CURL_NTLM_AUTH_TESTNUM");
      exit(1);
    }
    testnum = lnum;
  }
  else {
    logmsg("Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }

  env = getenv("CURL_NTLM_AUTH_SRCDIR");
  if(env) {
    path = env;
  }

  filename = test2file(testnum);
  stream=fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    /* get the ntlm_auth input/output */
    error = getpart(&type1_input, &size, "ntlm_auth_type1", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 1 input failed with error: %d", error);
      exit(1);
    }
  }

  stream=fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    size = 0;
    error = getpart(&type3_input, &size, "ntlm_auth_type3", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 3 input failed with error: %d", error);
      exit(1);
    }
  }

  while(fgets(buf, sizeof(buf), stdin)) {
    if(strcmp(buf, type1_input) == 0) {
      stream=fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type1_output, &size, "ntlm_auth_type1", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 1 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type1_output);
      fflush(stdout);
    }
    else if(strncmp(buf, type3_input, strlen(type3_input)) == 0) {
      stream=fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type3_output, &size, "ntlm_auth_type3", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 3 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type3_output);
      fflush(stdout);
    }
    else {
      printf("Unknown request\n");
      msgbuf = printable(buf, 0);
      if(msgbuf) {
        logmsg("invalid input: '%s'\n", msgbuf);
        free(msgbuf);
      }
      else
        logmsg("OOM formatting invalid input: '%s'\n", buf);
      exit(1);
    }
  }
  return 1;
}